

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_segments_track_size(long segment_size,mi_segments_tld_t *tld)

{
  int iVar1;
  mi_stat_count_t *in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (in_RDI < 0) {
    _mi_stat_decrease(in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    _mi_stat_increase(in_RSI,in_stack_ffffffffffffffe8);
  }
  iVar1 = -1;
  if (-1 < in_RDI) {
    iVar1 = 1;
  }
  in_RSI[0x24].total = (long)iVar1 + in_RSI[0x24].total;
  if ((ulong)in_RSI[0x24].peak < (ulong)in_RSI[0x24].total) {
    in_RSI[0x24].peak = in_RSI[0x24].total;
  }
  in_RSI[0x24].current = in_RDI + in_RSI[0x24].current;
  if ((ulong)in_RSI[0x25].total < (ulong)in_RSI[0x24].current) {
    in_RSI[0x25].total = in_RSI[0x24].current;
  }
  return;
}

Assistant:

static void mi_segments_track_size(long segment_size, mi_segments_tld_t* tld) {
  if (segment_size>=0) _mi_stat_increase(&tld->stats->segments,1);
                  else _mi_stat_decrease(&tld->stats->segments,1);
  tld->count += (segment_size >= 0 ? 1 : -1);
  if (tld->count > tld->peak_count) tld->peak_count = tld->count;
  tld->current_size += segment_size;
  if (tld->current_size > tld->peak_size) tld->peak_size = tld->current_size;
}